

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::printer_internal2::DefaultPrintNonContainerTo<iutest::detail::IsNullMatcher>
               (IsNullMatcher *value,iu_ostream *os)

{
  char local_20 [16];
  
  builtin_strncpy(local_20,"Is Null",8);
  std::__ostream_insert<char,std::char_traits<char>>(os,local_20,7);
  return;
}

Assistant:

void DefaultPrintNonContainerTo(const T& value, iu_ostream* os)
{
    using namespace ::iutest::detail::printer_internal; // NOLINT
    *os << value;
}